

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

void duckdb::BitpackingCompressionState<long,_true,_long>::BitpackingWriter::UpdateStats
               (BitpackingCompressionState<long,_true,_long> *state,idx_t count)

{
  unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true> *this;
  atomic<unsigned_long> *paVar1;
  long lVar2;
  pointer pCVar3;
  long lVar4;
  long lVar5;
  
  this = &state->current_segment;
  pCVar3 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->(this);
  LOCK();
  paVar1 = &(pCVar3->super_SegmentBase<duckdb::ColumnSegment>).count;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + count;
  UNLOCK();
  if ((state->state).all_invalid == false) {
    pCVar3 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
             operator->(this);
    lVar4 = (state->state).maximum;
    lVar5 = *(long *)((long)&(pCVar3->stats).statistics.stats_union + 8);
    lVar2 = *(long *)((long)&(pCVar3->stats).statistics.stats_union + 0x18);
    if (lVar4 <= lVar5) {
      lVar5 = lVar4;
    }
    *(long *)((long)&(pCVar3->stats).statistics.stats_union + 8) = lVar5;
    if (lVar4 < lVar2) {
      lVar4 = lVar2;
    }
    *(long *)((long)&(pCVar3->stats).statistics.stats_union + 0x18) = lVar4;
    pCVar3 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
             operator->(this);
    lVar4 = (state->state).minimum;
    lVar5 = *(long *)((long)&(pCVar3->stats).statistics.stats_union + 8);
    lVar2 = *(long *)((long)&(pCVar3->stats).statistics.stats_union + 0x18);
    if (lVar4 <= lVar5) {
      lVar5 = lVar4;
    }
    *(long *)((long)&(pCVar3->stats).statistics.stats_union + 8) = lVar5;
    if (lVar4 < lVar2) {
      lVar4 = lVar2;
    }
    *(long *)((long)&(pCVar3->stats).statistics.stats_union + 0x18) = lVar4;
  }
  return;
}

Assistant:

static void UpdateStats(BitpackingCompressionState<T, WRITE_STATISTICS> *state, idx_t count) {
			state->current_segment->count += count;

			if (WRITE_STATISTICS && !state->state.all_invalid) {
				state->current_segment->stats.statistics.template UpdateNumericStats<T>(state->state.maximum);
				state->current_segment->stats.statistics.template UpdateNumericStats<T>(state->state.minimum);
			}
		}